

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O0

void Abc_DesCleanManPointer(Abc_Des_t *p,void *pMan)

{
  int iVar1;
  void *pvVar2;
  int local_24;
  int i;
  Abc_Ntk_t *pTemp;
  void *pMan_local;
  Abc_Des_t *p_local;
  
  if (p != (Abc_Des_t *)0x0) {
    if (p->pManFunc == pMan) {
      p->pManFunc = (void *)0x0;
    }
    for (local_24 = 0; iVar1 = Vec_PtrSize(p->vModules), local_24 < iVar1; local_24 = local_24 + 1)
    {
      pvVar2 = Vec_PtrEntry(p->vModules,local_24);
      if (*(void **)((long)pvVar2 + 0x100) == pMan) {
        *(undefined8 *)((long)pvVar2 + 0x100) = 0;
      }
    }
  }
  return;
}

Assistant:

void Abc_DesCleanManPointer( Abc_Des_t * p, void * pMan )
{
    Abc_Ntk_t * pTemp;
    int i;
    if ( p == NULL )
        return;
    if ( p->pManFunc == pMan )
        p->pManFunc = NULL;
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pTemp, i )
        if ( pTemp->pManFunc == pMan )
            pTemp->pManFunc = NULL;
}